

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

void __thiscall btRigidBody::addConstraintRef(btRigidBody *this,btTypedConstraint *c)

{
  int iVar1;
  btRigidBody *co;
  btRigidBody *this_00;
  btTypedConstraint *c_local;
  
  c_local = c;
  iVar1 = btAlignedObjectArray<btTypedConstraint_*>::findLinearSearch
                    (&this->m_constraintRefs,&c_local);
  if (iVar1 == (this->m_constraintRefs).m_size) {
    btAlignedObjectArray<btTypedConstraint_*>::push_back(&this->m_constraintRefs,&c_local);
    this_00 = c_local->m_rbA;
    co = c_local->m_rbB;
    if (this_00 != this) {
      co = this_00;
      this_00 = c_local->m_rbB;
    }
    btCollisionObject::setIgnoreCollisionCheck
              (&this_00->super_btCollisionObject,&co->super_btCollisionObject,true);
  }
  return;
}

Assistant:

void btRigidBody::addConstraintRef(btTypedConstraint* c)
{
	///disable collision with the 'other' body

	int index = m_constraintRefs.findLinearSearch(c);
	//don't add constraints that are already referenced
	//btAssert(index == m_constraintRefs.size());
	if (index == m_constraintRefs.size())
	{
		m_constraintRefs.push_back(c);
		btCollisionObject* colObjA = &c->getRigidBodyA();
		btCollisionObject* colObjB = &c->getRigidBodyB();
		if (colObjA == this)
		{
			colObjA->setIgnoreCollisionCheck(colObjB, true);
		}
		else
		{
			colObjB->setIgnoreCollisionCheck(colObjA, true);
		}
	} 
}